

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O1

vector<void_*,_std::allocator<void_*>_> *
eglu::getConfigs(vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,Library *egl,
                EGLDisplay display)

{
  pointer ppvVar1;
  deUint32 dVar2;
  EGLint configCount;
  int local_1c;
  
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c = 0;
  (*egl->_vptr_Library[0x1a])(egl,display,0,0);
  dVar2 = (*egl->_vptr_Library[0x1f])(egl);
  checkError(dVar2,"getConfigs(display, DE_NULL, 0, &configCount)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0x66);
  if (0 < (long)local_1c) {
    std::vector<void_*,_std::allocator<void_*>_>::resize(__return_storage_ptr__,(long)local_1c);
    ppvVar1 = (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    (*egl->_vptr_Library[0x1a])
              (egl,display,ppvVar1,
               (ulong)((long)(__return_storage_ptr__->
                             super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)ppvVar1) >> 3,&local_1c);
    dVar2 = (*egl->_vptr_Library[0x1f])(egl);
    checkError(dVar2,"getConfigs(display, &(configs[0]), (EGLint)configs.size(), &configCount)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x6b);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<EGLConfig> getConfigs (const Library& egl, EGLDisplay display)
{
	vector<EGLConfig>	configs;
	EGLint				configCount	= 0;
	EGLU_CHECK_CALL(egl, getConfigs(display, DE_NULL, 0, &configCount));

	if (configCount > 0)
	{
		configs.resize(configCount);
		EGLU_CHECK_CALL(egl, getConfigs(display, &(configs[0]), (EGLint)configs.size(), &configCount));
	}

	return configs;
}